

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

ArgumentMismatch *
CLI::ArgumentMismatch::TypedAtLeast
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,string *type)

{
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_b8,name,": ");
  std::__cxx11::to_string(&sStack_d8,num);
  ::std::operator+(&local_98,&local_b8,&sStack_d8);
  ::std::operator+(&local_78,&local_98," required ");
  ::std::operator+(&local_58,&local_78,type);
  ::std::operator+(&local_38,&local_58," missing");
  ArgumentMismatch(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&sStack_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch TypedAtLeast(std::string name, int num, std::string type) {
        return ArgumentMismatch(name + ": " + std::to_string(num) + " required " + type + " missing");
    }